

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

FT_Error af_axis_hints_new_segment(AF_AxisHints axis,FT_Memory memory,AF_Segment_conflict *asegment)

{
  uint uVar1;
  FT_Alloc_Func p_Var2;
  uint local_38;
  FT_UInt big_max;
  FT_UInt new_max;
  FT_UInt old_max;
  AF_Segment_conflict segment;
  AF_Segment_conflict *ppAStack_20;
  FT_Error error;
  AF_Segment_conflict *asegment_local;
  FT_Memory memory_local;
  AF_AxisHints axis_local;
  
  segment._4_4_ = 0;
  _new_max = (AF_Segment_conflict)0x0;
  ppAStack_20 = asegment;
  memory_local = (FT_Memory)axis;
  if (axis->num_segments < 0x12) {
    if (axis->segments == (AF_Segment_conflict)0x0) {
      axis->segments = (axis->embedded).segments;
      axis->max_segments = 0x12;
    }
  }
  else if (axis->max_segments <= axis->num_segments) {
    uVar1 = axis->max_segments;
    if (0x1999998 < uVar1) {
      segment._4_4_ = 0x40;
      goto LAB_0036c757;
    }
    local_38 = (uVar1 >> 2) + 4 + uVar1;
    if ((local_38 < uVar1) || (0x1999999 < local_38)) {
      local_38 = 0x1999999;
    }
    asegment_local = (AF_Segment_conflict *)memory;
    if ((anon_struct_2496_2_23da31ad_for_embedded *)axis->segments == &axis->embedded) {
      p_Var2 = (FT_Alloc_Func)
               ft_mem_realloc(memory,0x50,0,(ulong)local_38,(void *)0x0,
                              (FT_Error *)((long)&segment + 4));
      memory_local->alloc = p_Var2;
      if (segment._4_4_ != 0) goto LAB_0036c757;
      memcpy(memory_local->alloc,&memory_local[1].alloc,0x5a0);
    }
    else {
      p_Var2 = (FT_Alloc_Func)
               ft_mem_realloc(memory,0x50,(ulong)uVar1,(ulong)local_38,axis->segments,
                              (FT_Error *)((long)&segment + 4));
      memory_local->alloc = p_Var2;
      if (segment._4_4_ != 0) goto LAB_0036c757;
    }
    *(uint *)((long)&memory_local->user + 4) = local_38;
  }
  uVar1 = *(uint *)&memory_local->user;
  *(uint *)&memory_local->user = uVar1 + 1;
  _new_max = (AF_Segment_conflict)(memory_local->alloc + (ulong)uVar1 * 0x50);
LAB_0036c757:
  *ppAStack_20 = _new_max;
  return segment._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_axis_hints_new_segment( AF_AxisHints  axis,
                             FT_Memory     memory,
                             AF_Segment   *asegment )
  {
    FT_Error    error   = FT_Err_Ok;
    AF_Segment  segment = NULL;


    if ( axis->num_segments < AF_SEGMENTS_EMBEDDED )
    {
      if ( !axis->segments )
      {
        axis->segments     = axis->embedded.segments;
        axis->max_segments = AF_SEGMENTS_EMBEDDED;
      }
    }
    else if ( axis->num_segments >= axis->max_segments )
    {
      FT_UInt  old_max = axis->max_segments;
      FT_UInt  new_max = old_max;
      FT_UInt  big_max = FT_INT_MAX / sizeof ( *segment );


      if ( old_max >= big_max )
      {
        error = FT_THROW( Out_Of_Memory );
        goto Exit;
      }

      new_max += ( new_max >> 2 ) + 4;
      if ( new_max < old_max || new_max > big_max )
        new_max = big_max;

      if ( axis->segments == axis->embedded.segments )
      {
        if ( FT_NEW_ARRAY( axis->segments, new_max ) )
          goto Exit;
        ft_memcpy( axis->segments, axis->embedded.segments,
                   sizeof ( axis->embedded.segments ) );
      }
      else
      {
        if ( FT_RENEW_ARRAY( axis->segments, old_max, new_max ) )
          goto Exit;
      }

      axis->max_segments = new_max;
    }

    segment = axis->segments + axis->num_segments++;

  Exit:
    *asegment = segment;
    return error;
  }